

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O2

char32_t plot::detail::utf8_cp<char_const*>(char *it,char *end)

{
  byte first;
  int iVar1;
  char32_t cVar2;
  
  first = *it;
  iVar1 = utf8_seq_length(first);
  if (iVar1 == 0) {
    cVar2 = L'\xffffffff';
  }
  else {
    cVar2 = (char32_t)(*(byte *)((long)&utf8_start_masks + (long)iVar1) & first);
    while (iVar1 = iVar1 + -1, 1 < iVar1) {
      cVar2 = cVar2 << 6;
    }
  }
  return cVar2;
}

Assistant:

inline char32_t utf8_cp(Iterator it, Iterator end) {
        char32_t cp = static_cast<std::uint8_t>(*it);
        auto len = utf8_seq_length(cp);

        if (!len)
            return std::numeric_limits<char32_t>::max();

        cp = (cp & utf8_start_masks[len]);

        while (--len > 0 && it != end && utf8_seq_cont(*++it))
            cp = (cp << 6) | (static_cast<std::uint8_t>(*it) & utf8_cont_mask);

        while (--len > 0)
            cp <<= 6;

        return cp;
    }